

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

void Gia_ManHashStart(Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  int iLitC;
  int *piVar2;
  bool bVar3;
  int local_24;
  int i;
  int *pPlace;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  Gia_ManHashAlloc(p);
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pPlace = (int *)Gia_ManObj(p,local_24);
      bVar3 = (Gia_Obj_t *)pPlace != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pPlace);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninLit0((Gia_Obj_t *)pPlace,local_24);
      iLit1 = Gia_ObjFaninLit1((Gia_Obj_t *)pPlace,local_24);
      iLitC = Gia_ObjFaninLit2(p,local_24);
      piVar2 = Gia_ManHashFind(p,iVar1,iLit1,iLitC);
      if (*piVar2 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0x85,"void Gia_ManHashStart(Gia_Man_t *)");
      }
      *piVar2 = local_24;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Gia_ManHashStart( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int * pPlace, i;
    Gia_ManHashAlloc( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pObj, i), Gia_ObjFaninLit1(pObj, i), Gia_ObjFaninLit2(p, i) );
        assert( *pPlace == 0 );
        *pPlace = i;
    }
}